

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

string * __thiscall
Liby::Buffer::retriveveAsString_abi_cxx11_(string *__return_storage_ptr__,Buffer *this,off_t len)

{
  ulong uVar1;
  off_t oVar2;
  char *pcVar3;
  allocator local_22;
  undefined1 local_21;
  ulong local_20;
  off_t len_local;
  Buffer *this_local;
  string *ret;
  
  local_20 = len;
  len_local = (off_t)this;
  this_local = (Buffer *)__return_storage_ptr__;
  if (-1 < len) {
    if ((len == 0) || (oVar2 = size(this), oVar2 < len)) {
      oVar2 = size(this);
      retriveveAsString_abi_cxx11_(__return_storage_ptr__,this,oVar2);
    }
    else {
      local_21 = 0;
      pcVar3 = data(this);
      uVar1 = local_20;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,uVar1,&local_22);
      std::allocator<char>::~allocator((allocator<char> *)&local_22);
      retrieve(this,local_20);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("len >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Buffer.cpp"
                ,0xf9,"std::string Liby::Buffer::retriveveAsString(off_t)");
}

Assistant:

std::string Buffer::retriveveAsString(off_t len) {
    assert(len >= 0);
    if (len == 0 || len > size())
        return retriveveAsString(size());
    std::string ret(data(), len);
    retrieve(len);
    return ret;
}